

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__at_eof(stbi__context *s)

{
  int iVar1;
  
  if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
    iVar1 = (*(s->io).eof)(s->io_user_data);
    if (iVar1 == 0) {
      return 0;
    }
    if (s->read_from_callbacks == 0) {
      return 1;
    }
  }
  return (uint)(s->img_buffer_end <= s->img_buffer);
}

Assistant:

stbi_inline static int stbi__at_eof(stbi__context *s)
{
   if (s->io.read) {
      if (!(s->io.eof)(s->io_user_data)) return 0;
      // if feof() is true, check if buffer = end
      // special case: we've only got the special 0 character at the end
      if (s->read_from_callbacks == 0) return 1;
   }

   return s->img_buffer >= s->img_buffer_end;
}